

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O0

EventMeta * rlib::midi::EventMeta::createTempo(double tempo)

{
  initializer_list<unsigned_char> __l;
  EventMeta *in_RDI;
  double in_XMM0_Qa;
  anon_union_4_2_323626a9 t;
  _unnamed_type_1_ *this;
  Type type_;
  uchar *in_stack_ffffffffffffffa0;
  EventMeta *this_00;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  iterator puVar4;
  size_type in_stack_ffffffffffffffd0;
  undefined4 local_14;
  double local_10;
  
  this = (_unnamed_type_1_ *)&local_14;
  local_10 = in_XMM0_Qa;
  createTempo(double)::{unnamed_type#1}::createTempo(this);
  local_14 = (undefined4)(long)(60000000.0 / local_10);
  std::reverse<unsigned_char*>(in_stack_ffffffffffffffa0,(uchar *)this);
  type_ = (Type)((ulong)this >> 0x20);
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffbd;
  puVar4 = (iterator)0x3;
  this_00 = (EventMeta *)&stack0xffffffffffffffbc;
  uVar1 = local_14._1_1_;
  uVar2 = local_14._2_1_;
  uVar3 = local_14._3_1_;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x11e4de);
  __l._M_len = in_stack_ffffffffffffffd0;
  __l._M_array = puVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_01,__l,
             (allocator_type *)
             CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,in_stack_ffffffffffffffb8))));
  EventMeta(this_00,type_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x11e522);
  return in_RDI;
}

Assistant:

static EventMeta createTempo(double tempo) {
			union {
				uint8_t		buf[4] = { 0, };
				uint32_t	tempo;
			}t;
			assert(sizeof(t) == 4);
			t.tempo = static_cast<uint32_t>(60000000.0 / tempo);		// 4分音符の時間(microsec)
			std::reverse(reinterpret_cast<uint8_t*>(&t.tempo), reinterpret_cast<uint8_t*>(&t.tempo) + sizeof(t.tempo));		// エンディアン変更
			return EventMeta(Type::tempo, { t.buf[1], t.buf[2], t.buf[3] });
		}